

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# createExpressions.cpp
# Opt level: O2

string * getAsmUsedRegString_abi_cxx11_(string *__return_storage_ptr__,ConstraintInfoVector *info)

{
  int iVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  long lVar3;
  bool bVar4;
  int *piVar5;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_347;
  allocator local_346;
  allocator local_345;
  allocator local_344;
  allocator local_343;
  allocator local_342;
  allocator local_341;
  allocator local_340;
  allocator local_33f;
  allocator local_33e;
  allocator local_33d;
  allocator local_33c;
  allocator local_33b;
  allocator local_33a;
  allocator local_339;
  allocator local_338;
  allocator local_337;
  allocator local_336;
  allocator local_335;
  allocator local_334;
  allocator local_333;
  allocator local_332;
  allocator local_331;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  string clobber;
  string local_2f0 [32];
  string local_2d0 [32];
  string local_2b0 [32];
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  if (getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
      ::CLOBBER_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                                 ::CLOBBER_abi_cxx11_);
    if (iVar1 != 0) {
      std::__cxx11::string::string((string *)&clobber,"memory",(allocator *)&local_330);
      std::__cxx11::string::string(local_2f0,"rax",&local_331);
      std::__cxx11::string::string(local_2d0,"eax",&local_332);
      std::__cxx11::string::string(local_2b0,"ax",&local_333);
      std::__cxx11::string::string(local_290,"al",&local_334);
      std::__cxx11::string::string(local_270,"rbx",&local_335);
      std::__cxx11::string::string(local_250,"ebx",&local_336);
      std::__cxx11::string::string(local_230,"bx",&local_337);
      std::__cxx11::string::string(local_210,"bl",&local_338);
      std::__cxx11::string::string(local_1f0,"rcx",&local_339);
      std::__cxx11::string::string(local_1d0,"ecx",&local_33a);
      std::__cxx11::string::string(local_1b0,"cx",&local_33b);
      std::__cxx11::string::string(local_190,"cl",&local_33c);
      std::__cxx11::string::string(local_170,"rdx",&local_33d);
      std::__cxx11::string::string(local_150,"edx",&local_33e);
      std::__cxx11::string::string(local_130,"dx",&local_33f);
      std::__cxx11::string::string(local_110,"dl",&local_340);
      std::__cxx11::string::string(local_f0,"rsi",&local_341);
      std::__cxx11::string::string(local_d0,"esi",&local_342);
      std::__cxx11::string::string(local_b0,"si",&local_343);
      std::__cxx11::string::string(local_90,"rdi",&local_344);
      std::__cxx11::string::string(local_70,"edi",&local_345);
      std::__cxx11::string::string(local_50,"di",&local_346);
      __l._M_len = 0x17;
      __l._M_array = &clobber;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                ::CLOBBER_abi_cxx11_,__l,&local_347);
      lVar3 = 0x2c0;
      do {
        std::__cxx11::string::~string(local_2f0 + lVar3 + -0x20);
        lVar3 = lVar3 + -0x20;
      } while (lVar3 != -0x20);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                    ::CLOBBER_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                           ::CLOBBER_abi_cxx11_);
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  bVar4 = true;
  for (piVar5 = *(int **)info; piVar5 != *(int **)(info + 8); piVar5 = piVar5 + 0x14) {
    if (*piVar5 == 2) {
      std::__cxx11::string::string((string *)&clobber,*(string **)(piVar5 + 4));
      std::__cxx11::string::substr((ulong)&local_330,(ulong)&clobber);
      std::__cxx11::string::operator=((string *)&clobber,(string *)&local_330);
      std::__cxx11::string::~string((string *)&local_330);
      _Var2 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                         ::CLOBBER_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
                         ::CLOBBER_abi_cxx11_.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,&clobber);
      if (_Var2._M_current !=
          getAsmUsedRegString[abi:cxx11](std::vector<llvm::InlineAsm::ConstraintInfo,std::allocator<llvm::InlineAsm::ConstraintInfo>>)
          ::CLOBBER_abi_cxx11_.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (!bVar4) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        iVar1 = std::__cxx11::string::compare((char *)&clobber);
        if (iVar1 != 0) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
        std::operator+(&local_330,&clobber,"\"");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_330);
        bVar4 = false;
      }
      std::__cxx11::string::~string((string *)&clobber);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getAsmUsedRegString(llvm::InlineAsm::ConstraintInfoVector info) {
    static std::vector<std::string> CLOBBER = {"memory", "rax", "eax", "ax", "al", "rbx", "ebx", "bx", "bl", "rcx", "ecx", "cx",
                                               "cl", "rdx", "edx", "dx", "dl", "rsi", "esi", "si", "rdi", "edi", "di"};

    std::string ret;
    bool first = true;

    for (llvm::InlineAsm::ConstraintInfoVector::iterator iter = info.begin(); iter != info.end(); iter++) {
        if (iter->Type != llvm::InlineAsm::isClobber) {
            continue;
        }

        std::string clobber = iter->Codes[0];
        clobber = clobber.substr(1, clobber.size() - 2);

        if (std::find(CLOBBER.begin(), CLOBBER.end(), clobber) != CLOBBER.end()) {
            if (!first) {
                ret += ", ";
            }
            first = false;

            ret += "\"";
            if (clobber.compare("memory") != 0) {
                ret += "%";
            }
            ret += clobber + "\"";
        }
    }

    return ret;
}